

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall Assimp::FBX::FBXConverter::~FBXConverter(FBXConverter *this)

{
  pointer ppaVar1;
  pointer ppaVar2;
  pointer ppaVar3;
  pointer ppaVar4;
  pointer ppaVar5;
  pointer ppaVar6;
  pointer ppaVar7;
  pointer ppaVar8;
  pointer ppaVar9;
  delete_fun<aiTexture> local_21;
  
  std::
  for_each<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,Assimp::FBX::Util::delete_fun<aiMesh>>
            ((this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,Assimp::FBX::Util::delete_fun<aiMaterial>>
            ((this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::
  for_each<__gnu_cxx::__normal_iterator<aiAnimation**,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>,Assimp::FBX::Util::delete_fun<aiAnimation>>
            ((this->animations).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->animations).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  ppaVar1 = (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppaVar7 = (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppaVar7 != ppaVar1; ppaVar7 = ppaVar7 + 1) {
    if (*ppaVar7 != (aiLight *)0x0) {
      operator_delete(*ppaVar7,0x46c);
    }
  }
  ppaVar2 = (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppaVar8 = (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppaVar8 != ppaVar2; ppaVar8 = ppaVar8 + 1) {
    if (*ppaVar8 != (aiCamera *)0x0) {
      operator_delete(*ppaVar8,0x438);
    }
  }
  ppaVar9 = (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppaVar3 = (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppaVar9 != ppaVar3) {
    do {
      Util::delete_fun<aiTexture>::operator()(&local_21,*ppaVar9);
      ppaVar9 = ppaVar9 + 1;
    } while (ppaVar9 != ppaVar3);
  }
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
  ::~_Rb_tree(&(this->bone_map)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->mNodeNames)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->node_anim_chain_bits)._M_t);
  std::
  _Rb_tree<const_Assimp::FBX::Geometry_*,_std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&(this->meshes_converted)._M_t);
  std::
  _Rb_tree<const_Assimp::FBX::Video,_std::pair<const_Assimp::FBX::Video,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>,_std::less<const_Assimp::FBX::Video>,_std::allocator<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->textures_converted)._M_t);
  std::
  _Rb_tree<const_Assimp::FBX::Material_*,_std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->materials_converted)._M_t);
  ppaVar9 = (this->textures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar9 != (pointer)0x0) {
    operator_delete(ppaVar9,(long)(this->textures).
                                  super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar9)
    ;
  }
  ppaVar8 = (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar8 != (pointer)0x0) {
    operator_delete(ppaVar8,(long)(this->cameras).
                                  super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar8)
    ;
  }
  ppaVar7 = (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar7 != (pointer)0x0) {
    operator_delete(ppaVar7,(long)(this->lights).
                                  super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppaVar7);
  }
  ppaVar4 = (this->animations).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppaVar4 != (pointer)0x0) {
    operator_delete(ppaVar4,(long)(this->animations).
                                  super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar4)
    ;
  }
  ppaVar5 = (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppaVar5 != (pointer)0x0) {
    operator_delete(ppaVar5,(long)(this->materials).
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppaVar5)
    ;
  }
  ppaVar6 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar6 != (pointer)0x0) {
    operator_delete(ppaVar6,(long)(this->meshes).
                                  super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppaVar6);
  }
  return;
}

Assistant:

FBXConverter::~FBXConverter() {
            std::for_each(meshes.begin(), meshes.end(), Util::delete_fun<aiMesh>());
            std::for_each(materials.begin(), materials.end(), Util::delete_fun<aiMaterial>());
            std::for_each(animations.begin(), animations.end(), Util::delete_fun<aiAnimation>());
            std::for_each(lights.begin(), lights.end(), Util::delete_fun<aiLight>());
            std::for_each(cameras.begin(), cameras.end(), Util::delete_fun<aiCamera>());
            std::for_each(textures.begin(), textures.end(), Util::delete_fun<aiTexture>());
        }